

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

Gia_Man_t * Dam_ManMultiAig(Dam_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  int Entry;
  Gia_Man_t *p;
  char *pcVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  
  pGVar7 = pMan->pGia;
  p = Gia_ManStart(pGVar7->nObjs * 2);
  pcVar3 = Abc_UtilStrsav(pGVar7->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pGVar7->pSpec);
  p->pSpec = pcVar3;
  iVar8 = p->nObjsAlloc;
  puVar4 = (uint *)calloc((long)iVar8,4);
  p->pMuxes = puVar4;
  pVVar5 = Vec_IntStart(iVar8);
  p->vLevels = pVVar5;
  Gia_ManFillValue(pGVar7);
  pGVar7->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < pGVar7->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar6 = Gia_ManCi(pGVar7,iVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p);
    pGVar6->Value = uVar1;
    pVVar5 = p->vLevels;
    iVar2 = Abc_Lit2Var(uVar1);
    Entry = Gia_ObjLevel(pGVar7,pGVar6);
    Vec_IntWriteEntry(pVVar5,iVar2,Entry);
  }
  Gia_ManHashStart(p);
  iVar8 = 0;
  if (pGVar7->nBufs == 0) {
    iVar8 = pGVar7->nObjs;
  }
  for (; iVar8 < pGVar7->nObjs; iVar8 = iVar8 + 1) {
    pGVar6 = Gia_ManObj(pGVar7,iVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjIsBuf(pGVar6);
    if (iVar2 != 0) {
      Dam_ManMultiAig_rec(pMan,p,pGVar7,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff))
      ;
      iVar2 = Gia_ObjFanin0Copy(pGVar6);
      uVar1 = Gia_ManAppendBuf(p,iVar2);
      pGVar6->Value = uVar1;
      iVar2 = Abc_Lit2Var(uVar1);
      pGVar6 = Gia_ManObj(p,iVar2);
      Gia_ObjSetGateLevel(p,pGVar6);
    }
  }
  for (iVar8 = 0; iVar8 < pGVar7->vCos->nSize; iVar8 = iVar8 + 1) {
    pGVar6 = Gia_ManCo(pGVar7,iVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    Dam_ManMultiAig_rec(pMan,p,pGVar7,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff));
    iVar2 = Gia_ObjFanin0Copy(pGVar6);
    uVar1 = Gia_ManAppendCo(p,iVar2);
    pGVar6->Value = uVar1;
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,pGVar7->nRegs);
  pGVar7 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar7;
}

Assistant:

Gia_Man_t * Dam_ManMultiAig( Dam_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->vLevels = Vec_IntStart( pNew->nObjsAlloc );
    // create constant and inputs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        Vec_IntWriteEntry( pNew->vLevels, Abc_Lit2Var(pObj->Value), Gia_ObjLevel(p, pObj) );
    }
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachBuf( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(p) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}